

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_chain_operation<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
               (Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>
                *m)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer pIVar4;
  pointer puVar5;
  ID_index IVar6;
  Column_dimension_option CVar7;
  ID_index IVar8;
  bool bVar9;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  anon_class_1_0_00000001 local_63;
  anon_class_1_0_00000001 local_62;
  anon_class_1_0_00000001 local_61;
  anon_class_8_1_e4bd5e45 local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined8 local_50;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_48;
  anon_class_8_1_e4bd5e45 local_30;
  
  build_simple_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>
            ();
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_48,m);
  pIVar4 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60.targetColumn = pIVar4 + 5;
  uVar1 = pIVar4[5].super_Chain_column_option.pivot_;
  local_30.targetColumn = local_60.targetColumn;
  bVar9 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gu___persistence_matrix::Column_types)7,false,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                    (pIVar4 + 3,local_60.targetColumn,&local_62,&local_60,&local_30,&local_63,
                     &local_61);
  if (bVar9) {
    IVar6 = pIVar4[3].super_Chain_column_option.pivot_;
    CVar7.dim_ = pIVar4[5].super_Column_dimension_option.dim_;
    IVar8 = pIVar4[5].super_Chain_column_option.pivot_;
    pIVar4[5].super_Column_dimension_option =
         (Column_dimension_option)pIVar4[3].super_Column_dimension_option.dim_;
    pIVar4[5].super_Chain_column_option.pivot_ = IVar6;
    pIVar4[3].super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
    pIVar4[3].super_Chain_column_option.pivot_ = IVar8;
  }
  uVar2 = pIVar4[5].super_Chain_column_option.pivot_;
  if (uVar1 != uVar2) {
    puVar5 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = puVar5[uVar1];
    puVar5[uVar1] = puVar5[uVar2];
    puVar5[uVar2] = uVar3;
  }
  local_60.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
        *)0x200000003;
  uStack_58 = 4;
  uStack_54 = 1;
  local_50 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_60);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_48,m);
  pIVar4 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60.targetColumn = pIVar4 + 5;
  uVar1 = pIVar4[5].super_Chain_column_option.pivot_;
  local_30.targetColumn = local_60.targetColumn;
  bVar9 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gu___persistence_matrix::Column_types)7,false,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                    (pIVar4 + 4,local_60.targetColumn,&local_62,&local_60,&local_30,&local_63,
                     &local_61);
  if (bVar9) {
    IVar6 = pIVar4[4].super_Chain_column_option.pivot_;
    CVar7.dim_ = pIVar4[5].super_Column_dimension_option.dim_;
    IVar8 = pIVar4[5].super_Chain_column_option.pivot_;
    pIVar4[5].super_Column_dimension_option =
         (Column_dimension_option)pIVar4[4].super_Column_dimension_option.dim_;
    pIVar4[5].super_Chain_column_option.pivot_ = IVar6;
    pIVar4[4].super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
    pIVar4[4].super_Chain_column_option.pivot_ = IVar8;
  }
  uVar2 = pIVar4[5].super_Chain_column_option.pivot_;
  if (uVar1 != uVar2) {
    puVar5 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = puVar5[uVar1];
    puVar5[uVar1] = puVar5[uVar2];
    puVar5[uVar2] = uVar3;
  }
  local_60.targetColumn._0_4_ = 3;
  local_60.targetColumn._4_4_ = 3;
  uStack_58 = 4;
  uStack_54 = 2;
  local_50 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_60);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_48,m);
  uVar1 = (m->colSettings_->operators).characteristic_;
  local_60.targetColumn._0_4_ = 3;
  if ((int)uVar1 < 4) {
    local_60.targetColumn._0_4_ = (undefined4)(3 % (ulong)uVar1);
  }
  pIVar4 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = pIVar4[3].super_Chain_column_option.pivot_;
  bVar9 = Gudhi::persistence_matrix::
          _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>
                    ((Field_element *)&local_60,pIVar4 + 5,pIVar4 + 3);
  if (bVar9) {
    CVar7.dim_ = pIVar4[3].super_Column_dimension_option.dim_;
    IVar8 = pIVar4[3].super_Chain_column_option.pivot_;
    IVar6 = pIVar4[5].super_Chain_column_option.pivot_;
    pIVar4[3].super_Column_dimension_option =
         (Column_dimension_option)pIVar4[5].super_Column_dimension_option.dim_;
    pIVar4[3].super_Chain_column_option.pivot_ = IVar6;
    pIVar4[5].super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
    pIVar4[5].super_Chain_column_option.pivot_ = IVar8;
  }
  uVar2 = pIVar4[3].super_Chain_column_option.pivot_;
  if (uVar1 != uVar2) {
    puVar5 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = puVar5[uVar1];
    puVar5[uVar1] = puVar5[uVar2];
    puVar5[uVar2] = uVar3;
  }
  local_60.targetColumn._0_4_ = 3;
  local_60.targetColumn._4_4_ = 1;
  uStack_58 = 4;
  uStack_54 = 2;
  local_50 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3),&local_60);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_48,m);
  uVar1 = (m->colSettings_->operators).characteristic_;
  local_60.targetColumn._0_4_ = 4;
  if ((int)uVar1 < 5) {
    local_60.targetColumn._0_4_ = (undefined4)(4 % (ulong)uVar1);
  }
  pIVar4 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = pIVar4[4].super_Chain_column_option.pivot_;
  bVar9 = Gudhi::persistence_matrix::
          _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>
                    ((Field_element *)&local_60,pIVar4 + 5,pIVar4 + 4);
  if (bVar9) {
    CVar7.dim_ = pIVar4[4].super_Column_dimension_option.dim_;
    IVar8 = pIVar4[4].super_Chain_column_option.pivot_;
    IVar6 = pIVar4[5].super_Chain_column_option.pivot_;
    pIVar4[4].super_Column_dimension_option =
         (Column_dimension_option)pIVar4[5].super_Column_dimension_option.dim_;
    pIVar4[4].super_Chain_column_option.pivot_ = IVar6;
    pIVar4[5].super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
    pIVar4[5].super_Chain_column_option.pivot_ = IVar8;
  }
  uVar2 = pIVar4[4].super_Chain_column_option.pivot_;
  if (uVar1 != uVar2) {
    puVar5 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = puVar5[uVar1];
    puVar5[uVar1] = puVar5[uVar2];
    puVar5[uVar2] = uVar3;
  }
  local_60.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
        *)0x300000003;
  uStack_58 = 4;
  uStack_54 = 4;
  local_50 = 0x100000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4),&local_60);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>
            (&local_48,m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void test_chain_operation(Matrix& m) {
  auto columns = build_simple_chain_matrix<typename Matrix::Column>();

  test_content_equality(columns, m);

  m.add_to(3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {4, 5};
  } else {
    columns[5] = {{3, 2}, {4, 1}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.add_to(4, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {3, 5};
  } else {
    columns[5] = {{3, 3}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_target_and_add_to(5, 3, 3);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[3] = {5};
  } else {
    columns[3] = {{3, 1}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_source_and_add_to(4, 5, 4);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {3, 4};
  } else {
    columns[4] = {{3, 3}, {4, 4}, {5, 1}};
  }
  test_content_equality(columns, m);
}